

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLinearSCC
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  pointer pvVar1;
  bool bVar2;
  pointer pPVar3;
  ulong uVar4;
  ulong uVar5;
  uint lhs;
  ulong uVar6;
  bool bVar7;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  bool local_61;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  local_61 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish ==
             (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  if (!local_61) {
    uVar6 = 0;
    do {
      pvVar1 = (g->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar3 = pvVar1[uVar6].
               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar7 = *(pointer *)
               ((long)&pvVar1[uVar6].
                       super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                       ._M_impl.super__Vector_impl_data + 8) != pPVar3;
      lhs = (uint)uVar6;
      if (bVar7) {
        uVar4 = 0;
        uVar5 = 1;
        do {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    (&local_48,
                     (g->rules).
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar3[uVar4].rule);
          bVar2 = isLLRule(this,g,lhs,&local_48,group_set);
          if (!bVar2) {
            if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
LAB_00154d88:
            if (bVar7) {
              return local_61;
            }
            break;
          }
          bVar2 = isRLRule(this,g,lhs,&local_48,group_set);
          if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar2) goto LAB_00154d88;
          pvVar1 = (g->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar3 = pvVar1[uVar6].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = (long)*(pointer *)
                         ((long)&pvVar1[uVar6].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - (long)pPVar3 >> 2;
          bVar7 = uVar5 < uVar4;
          bVar2 = uVar5 < uVar4;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
      }
      uVar6 = (ulong)(lhs + 1);
      uVar4 = (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      local_61 = uVar4 <= uVar6;
    } while (uVar6 < uVar4);
  }
  return local_61;
}

Assistant:

bool isLinearSCC (const CFG &g, 
                    const vector<int> &group, 
                    const set<int>    &group_set)
  {
    for ( unsigned int vv = 0; vv < group.size(); vv++ )
    {
      for ( unsigned int ri = 0; ri < g.prods[vv].size(); ri++ )
      {
        int r = g.prods[vv][ri].rule;
        vector<EdgeSym> RHS = g.rules[r];
        if (!isLLRule(g, vv, RHS, group_set)) return false;
        if (!isRLRule(g, vv, RHS, group_set)) return false;
      }
    }
    // here all rules are either left-linear or right-linear.
    return true;
  }